

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void lower_bound_sorted_suite::find_even_last_predicate(void)

{
  array<int,_4UL> storage;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48 [2];
  int *local_40;
  undefined4 *local_38;
  
  local_58 = 0x2c;
  uStack_54 = 0x21;
  uStack_50 = 0x16;
  uStack_4c = 0xb;
  local_5c = 0xc;
  local_40 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_58,local_48,&local_5c);
  local_38 = &uStack_4c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{})",
             "std::next(storage.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f3,"void lower_bound_sorted_suite::find_even_last_predicate()",&local_40,&local_38)
  ;
  local_5c = 0xb;
  local_40 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_58,local_48,&local_5c);
  local_38 = &uStack_4c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{})",
             "std::next(storage.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f5,"void lower_bound_sorted_suite::find_even_last_predicate()",&local_40,&local_38)
  ;
  local_5c = 10;
  local_40 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_58,local_48,&local_5c);
  local_38 = local_48;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{})",
             "storage.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f7,"void lower_bound_sorted_suite::find_even_last_predicate()",&local_40,&local_38)
  ;
  return;
}

Assistant:

void find_even_last_predicate()
{
    std::array<int, 4> storage = { 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{}),
                  std::next(storage.begin(), 3));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{}),
                  std::next(storage.begin(), 3));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{}),
                  storage.end());
}